

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

void fill_window(deflate_state *s)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  z_streamp_conflict pzVar5;
  Bytef *pBVar6;
  uint len;
  uint uVar7;
  ushort *puVar8;
  uLong uVar9;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  uInt uVar13;
  ulong __n;
  uint uVar15;
  uint uVar14;
  
  uVar3 = s->w_size;
  __n = (ulong)uVar3;
  uVar13 = s->lookahead;
  do {
    uVar15 = s->strstart;
    uVar11 = (int)s->window_size - (uVar13 + uVar15);
    if (s->w_size + (uVar3 - 0x106) <= uVar15) {
      memcpy(s->window,s->window + __n,__n);
      uVar1 = s->strstart;
      uVar2 = s->match_start;
      uVar15 = uVar1 - uVar3;
      s->strstart = uVar15;
      s->match_start = uVar2 - uVar3;
      s->block_start = s->block_start - __n;
      uVar12 = (ulong)s->hash_size;
      puVar8 = s->head + uVar12;
      do {
        puVar8 = puVar8 + -1;
        uVar10 = *puVar8 - (short)uVar3;
        if (*puVar8 < uVar3) {
          uVar10 = 0;
        }
        *puVar8 = uVar10;
        uVar7 = (int)uVar12 - 1;
        uVar12 = (ulong)uVar7;
      } while (uVar7 != 0);
      puVar8 = s->prev + (__n - 1);
      uVar7 = uVar3;
      do {
        uVar10 = *puVar8 - (short)uVar3;
        if (*puVar8 < uVar3) {
          uVar10 = 0;
        }
        *puVar8 = uVar10;
        puVar8 = puVar8 + -1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      uVar11 = uVar11 + uVar3;
    }
    pzVar5 = s->strm;
    uVar7 = pzVar5->avail_in;
    if (uVar7 == 0) {
      return;
    }
    uVar14 = s->lookahead;
    len = uVar11;
    if (uVar7 < uVar11) {
      len = uVar7;
    }
    uVar12 = (ulong)len;
    if (uVar11 != 0) {
      pBVar6 = s->window;
      pzVar5->avail_in = uVar7 - len;
      iVar4 = pzVar5->state->wrap;
      if (iVar4 == 2) {
        uVar9 = cm_zlib_crc32(pzVar5->adler,pzVar5->next_in,len);
LAB_0049d4b3:
        pzVar5->adler = uVar9;
      }
      else if (iVar4 == 1) {
        uVar9 = cm_zlib_adler32(pzVar5->adler,pzVar5->next_in,len);
        goto LAB_0049d4b3;
      }
      memcpy(pBVar6 + (ulong)uVar14 + (ulong)uVar15,pzVar5->next_in,uVar12);
      pzVar5->next_in = pzVar5->next_in + uVar12;
      pzVar5->total_in = pzVar5->total_in + uVar12;
      uVar14 = s->lookahead;
    }
    uVar13 = uVar14 + len;
    s->lookahead = uVar13;
    if (2 < uVar13) {
      uVar15 = (uint)s->window[s->strstart];
      s->ins_h = uVar15;
      s->ins_h = ((uint)s->window[s->strstart + 1] ^ uVar15 << ((byte)s->hash_shift & 0x1f)) &
                 s->hash_mask;
      if (0x105 < uVar13) {
        return;
      }
    }
    if (s->strm->avail_in == 0) {
      return;
    }
  } while( true );
}

Assistant:

local void fill_window(s)
    deflate_state *s;
{
    register unsigned n, m;
    register Posf *p;
    unsigned more;    /* Amount of free space at the end of the window. */
    uInt wsize = s->w_size;

    do {
        more = (unsigned)(s->window_size -(ulg)s->lookahead -(ulg)s->strstart);

        /* Deal with !@#$% 64K limit: */
        if (sizeof(int) <= 2) {
            if (more == 0 && s->strstart == 0 && s->lookahead == 0) {
                more = wsize;

            } else if (more == (unsigned)(-1)) {
                /* Very unlikely, but possible on 16 bit machine if
                 * strstart == 0 && lookahead == 1 (input done a byte at time)
                 */
                more--;
            }
        }

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize+MAX_DIST(s)) {

            zmemcpy(s->window, s->window+wsize, (unsigned)wsize);
            s->match_start -= wsize;
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (long) wsize;

            /* Slide the hash table (could be avoided with 32 bit values
               at the expense of memory usage). We slide even when level == 0
               to keep the hash table consistent if we switch back to level > 0
               later. (Using level 0 permanently is not an optimal usage of
               zlib, so we don't care about this pathological case.)
             */
            /* %%% avoid this when Z_RLE */
            n = s->hash_size;
            p = &s->head[n];
            do {
                m = *--p;
                *p = (Pos)(m >= wsize ? m-wsize : NIL);
            } while (--n);

            n = wsize;
#ifndef FASTEST
            p = &s->prev[n];
            do {
                m = *--p;
                *p = (Pos)(m >= wsize ? m-wsize : NIL);
                /* If n is not on any hash chain, prev[n] is garbage but
                 * its value will never be used.
                 */
            } while (--n);
#endif
            more += wsize;
        }
        if (s->strm->avail_in == 0) return;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = read_buf(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead >= MIN_MATCH) {
            s->ins_h = s->window[s->strstart];
            UPDATE_HASH(s, s->ins_h, s->window[s->strstart+1]);
#if MIN_MATCH != 3
            Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
        }
        /* If the whole input has less than MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */

    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);
}